

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_output_model(options_i *options,vw *all)

{
  string *location;
  int iVar1;
  option_group_definition *poVar2;
  ostream *poVar3;
  option_group_definition output_model_options;
  allocator local_893;
  allocator local_892;
  allocator local_891;
  allocator local_890;
  allocator local_88f;
  allocator local_88e;
  allocator local_88d;
  allocator local_88c;
  allocator local_88b;
  allocator local_88a;
  allocator local_889;
  allocator local_888;
  allocator local_887;
  allocator local_886;
  allocator local_885;
  allocator local_884;
  allocator local_883;
  allocator local_882;
  allocator local_881;
  string local_880 [32];
  string local_860;
  string local_840 [32];
  string local_820;
  string local_800 [32];
  string local_7e0;
  string local_7c0 [32];
  string local_7a0;
  string local_780 [32];
  string local_760;
  string local_740 [32];
  string local_720;
  string local_700 [32];
  string local_6e0;
  string local_6c0 [32];
  string local_6a0;
  string local_680 [32];
  string local_660 [32];
  string local_640;
  string local_620;
  option_group_definition local_600;
  undefined1 local_5c8 [80];
  string local_578 [80];
  undefined1 local_528 [160];
  undefined1 local_488 [160];
  undefined1 local_3e8 [160];
  undefined1 local_348 [160];
  undefined1 local_2a8 [160];
  undefined1 local_208 [160];
  undefined1 local_168 [160];
  undefined1 local_c8 [160];
  
  std::__cxx11::string::string((string *)&local_620,"Output model",(allocator *)local_5c8);
  VW::config::option_group_definition::option_group_definition(&local_600,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::string((string *)&local_640,"final_regressor",&local_881);
  location = &all->final_regressor_name;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5c8,&local_640,location);
  std::__cxx11::string::string(local_660,"f",&local_882);
  std::__cxx11::string::_M_assign(local_578);
  std::__cxx11::string::string(local_680,"Final regressor",&local_883);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&local_600,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_5c8);
  std::__cxx11::string::string((string *)&local_6a0,"readable_model",&local_884);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_528,&local_6a0,&all->text_regressor_name);
  std::__cxx11::string::string
            (local_6c0,"Output human-readable final regressor with numeric features",&local_885);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_528);
  std::__cxx11::string::string((string *)&local_6e0,"invert_hash",&local_886);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,&local_6e0,&all->inv_hash_regressor_name);
  std::__cxx11::string::string
            (local_700,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,&local_887);
  std::__cxx11::string::_M_assign((string *)(local_c8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_c8);
  std::__cxx11::string::string((string *)&local_720,"save_resume",&local_888);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_168,&local_720,&all->save_resume);
  std::__cxx11::string::string
            (local_740,"save extra state so learning can be resumed later with new data",&local_889)
  ;
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_168);
  std::__cxx11::string::string((string *)&local_760,"preserve_performance_counters",&local_88a);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_208,&local_760,&all->preserve_performance_counters);
  std::__cxx11::string::string(local_780,"reset performance counters when warmstarting",&local_88b);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_208);
  std::__cxx11::string::string((string *)&local_7a0,"save_per_pass",&local_88c);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a8,&local_7a0,&all->save_per_pass);
  std::__cxx11::string::string(local_7c0,"Save the model after every pass over data",&local_88d);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_2a8);
  std::__cxx11::string::string((string *)&local_7e0,"output_feature_regularizer_binary",&local_88e);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_348,&local_7e0,&all->per_feature_regularizer_output);
  std::__cxx11::string::string(local_800,"Per feature regularization output file",&local_88f);
  std::__cxx11::string::_M_assign((string *)(local_348 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_348);
  std::__cxx11::string::string((string *)&local_820,"output_feature_regularizer_text",&local_890);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3e8,&local_820,&all->per_feature_regularizer_text);
  std::__cxx11::string::string
            (local_840,"Per feature regularization output file, in text",&local_891);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3e8);
  std::__cxx11::string::string((string *)&local_860,"id",&local_892);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_488,&local_860,&all->id);
  std::__cxx11::string::string
            (local_880,"User supplied ID embedded into the final regressor",&local_893);
  std::__cxx11::string::_M_assign((string *)(local_488 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar2,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_488);
  std::__cxx11::string::~string(local_880);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_488);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string(local_840);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3e8);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string(local_800);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_348);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string(local_7c0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string(local_780);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_208);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string(local_740);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_168);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string(local_700);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c8);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string(local_6c0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_528);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_660);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_5c8);
  std::__cxx11::string::~string((string *)&local_640);
  (**options->_vptr_options_i)(options,&local_600);
  iVar1 = std::__cxx11::string::compare((char *)location);
  if ((iVar1 != 0) && (all->quiet == false)) {
    poVar3 = std::operator<<(&(all->trace_message).super_ostream,"final_regressor = ");
    poVar3 = std::operator<<(poVar3,(string *)location);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::string((string *)local_5c8,"invert_hash",(allocator *)local_528);
  iVar1 = (*options->_vptr_options_i[1])(options,local_5c8);
  std::__cxx11::string::~string((string *)local_5c8);
  if ((char)iVar1 != '\0') {
    all->hash_inv = true;
  }
  VW::config::option_group_definition::~option_group_definition(&local_600);
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}